

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int input_insn_var_iterator_next
              (gen_ctx_t gen_ctx,insn_var_iterator_t *iter,MIR_reg_t *var,int *op_num)

{
  char cVar1;
  MIR_reg_t MVar2;
  MIR_insn_t pMVar3;
  size_t sVar4;
  undefined8 in_RAX;
  ulong nop;
  size_t sVar5;
  int out_p;
  undefined8 uStack_38;
  
  nop = iter->op_num;
  if (nop < iter->nops) {
    uStack_38 = in_RAX;
    do {
      *op_num = (int)nop;
      MIR_insn_op_mode(gen_ctx->ctx,iter->insn,nop,(int *)((long)&uStack_38 + 4));
      pMVar3 = iter->insn;
      sVar4 = iter->op_num;
      if ((uStack_38._4_4_ == 0) || (pMVar3->ops[sVar4].field_0x8 == '\v')) {
        if (iter->op_part_num < 2) {
          sVar5 = iter->op_part_num + 1;
          do {
            cVar1 = pMVar3->ops[sVar4].field_0x8;
            if (cVar1 != '\v') {
              if ((sVar5 != 2) && (cVar1 == '\x02')) {
                *var = pMVar3->ops[sVar4].u.reg;
LAB_001606ba:
                iter->op_part_num = sVar5;
                return 1;
              }
              break;
            }
            MVar2 = *(MIR_reg_t *)((long)&pMVar3->ops[sVar4].u + (ulong)(sVar5 != 1) * 4 + 0x10);
            *var = MVar2;
            if (MVar2 != 0xffffffff) goto LAB_001606ba;
            iter->op_part_num = sVar5;
            sVar5 = sVar5 + 1;
          } while (sVar5 == 2);
        }
        iter->op_num = sVar4 + 1;
        iter->op_part_num = 0;
      }
      else {
        iter->op_num = sVar4 + 1;
      }
      nop = iter->op_num;
    } while (nop < iter->nops);
  }
  return 0;
}

Assistant:

static inline int input_insn_var_iterator_next (gen_ctx_t gen_ctx, insn_var_iterator_t *iter,
                                                MIR_reg_t *var, int *op_num) {
  MIR_op_t *op_ref;
  int out_p;

  while (iter->op_num < iter->nops) {
    *op_num = (int) iter->op_num;
    MIR_insn_op_mode (gen_ctx->ctx, iter->insn, iter->op_num, &out_p);
    op_ref = &iter->insn->ops[iter->op_num];
    if (out_p && op_ref->mode != MIR_OP_VAR_MEM) {
      iter->op_num++;
      continue;
    }
    while (iter->op_part_num < 2) {
      if (op_ref->mode == MIR_OP_VAR_MEM) {
        *var = iter->op_part_num == 0 ? op_ref->u.var_mem.base : op_ref->u.var_mem.index;
        if (*var == MIR_NON_VAR) {
          iter->op_part_num++;
          continue;
        }
      } else if (iter->op_part_num > 0) {
        break;
      } else if (op_ref->mode == MIR_OP_VAR) {
        *var = op_ref->u.var;
      } else
        break;
      iter->op_part_num++;
      return TRUE;
    }
    iter->op_num++;
    iter->op_part_num = 0;
  }
  return FALSE;
}